

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall QString::operator=(QString *this,QLatin1StringView other)

{
  char16_t *pcVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  QString *this_00;
  Data *pDVar4;
  storage_type *psVar5;
  QString *size;
  char *__s;
  long in_FS_OFFSET;
  bool bVar6;
  QByteArrayView ba;
  QString local_38;
  long local_20;
  
  size = (QString *)other.m_size;
  __s = other.m_data;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->d).d;
  if (pDVar4 != (Data *)0x0) {
    pQVar2 = &pDVar4->super_QArrayData;
    pcVar1 = (this->d).ptr;
    if (((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1) &&
       (pDVar4 = (Data *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0
                         ), (long)size <= pQVar2->alloc - ((long)pcVar1 - (long)pDVar4 >> 1))) {
      (this->d).size = (qsizetype)size;
      pcVar1[(long)size] = L'\0';
      qt_from_latin1(pcVar1,__s,(size_t)size);
      goto LAB_00124aa6;
    }
  }
  this_00 = (QString *)0x0;
  if (0 < (long)size) {
    this_00 = size;
  }
  bVar6 = __s == (char *)0x0;
  if (bVar6) {
    this_00 = (QString *)0x0;
  }
  psVar5 = (storage_type *)CONCAT71((int7)((ulong)pDVar4 >> 8),bVar6 || -1 < (long)size);
  if (!bVar6 && -1 >= (long)size) {
    this_00 = (QString *)strlen(__s);
  }
  ba.m_data = psVar5;
  ba.m_size = (qsizetype)__s;
  fromLatin1(&local_38,this_00,ba);
  pQVar2 = &((this->d).d)->super_QArrayData;
  pcVar1 = (this->d).ptr;
  (this->d).d = local_38.d.d;
  (this->d).ptr = local_38.d.ptr;
  qVar3 = (this->d).size;
  (this->d).size = local_38.d.size;
  local_38.d.d = (Data *)pQVar2;
  local_38.d.ptr = pcVar1;
  local_38.d.size = qVar3;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
LAB_00124aa6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::operator=(QLatin1StringView other)
{
    const qsizetype capacityAtEnd = capacity() - d.freeSpaceAtBegin();
    if (isDetached() && other.size() <= capacityAtEnd) { // assumes d->alloc == 0 -> !isDetached() (sharedNull)
        d.size = other.size();
        d.data()[other.size()] = 0;
        qt_from_latin1(d.data(), other.latin1(), other.size());
    } else {
        *this = fromLatin1(other.latin1(), other.size());
    }
    return *this;
}